

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O0

void Gia_QbfPrint(Qbf_Man_t *p,Vec_Int_t *vValues,int Iter)

{
  int iVar1;
  abctime aVar2;
  uint local_28;
  uint local_24;
  uint local_20;
  int Iter_local;
  Vec_Int_t *vValues_local;
  Qbf_Man_t *p_local;
  
  printf("%5d : ",(ulong)(uint)Iter);
  iVar1 = Vec_IntSize(vValues);
  if (iVar1 == p->nVars) {
    Vec_IntPrintBinary(vValues);
    printf("  ");
    if (p->pSatSynG == (bmcg_sat_solver *)0x0) {
      local_20 = sat_solver_nvars(p->pSatSyn);
    }
    else {
      local_20 = bmcg_sat_solver_varnum(p->pSatSynG);
    }
    printf("Var =%7d  ",(ulong)local_20);
    if (p->pSatSynG == (bmcg_sat_solver *)0x0) {
      local_24 = sat_solver_nclauses(p->pSatSyn);
    }
    else {
      local_24 = bmcg_sat_solver_clausenum(p->pSatSynG);
    }
    printf("Cla =%7d  ",(ulong)local_24);
    if (p->pSatSynG == (bmcg_sat_solver *)0x0) {
      local_28 = sat_solver_nconflicts(p->pSatSyn);
    }
    else {
      local_28 = bmcg_sat_solver_conflictnum(p->pSatSynG);
    }
    printf("Conf =%9d  ",(ulong)local_28);
    aVar2 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar2 - p->clkStart);
    return;
  }
  __assert_fail("Vec_IntSize(vValues) == p->nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaQbf.c"
                ,0x219,"void Gia_QbfPrint(Qbf_Man_t *, Vec_Int_t *, int)");
}

Assistant:

void Gia_QbfPrint( Qbf_Man_t * p, Vec_Int_t * vValues, int Iter )
{
    printf( "%5d : ", Iter );
    assert( Vec_IntSize(vValues) == p->nVars );
    Vec_IntPrintBinary( vValues ); printf( "  " );
    printf( "Var =%7d  ",  p->pSatSynG ? bmcg_sat_solver_varnum(p->pSatSynG)      : sat_solver_nvars(p->pSatSyn)      );
    printf( "Cla =%7d  ",  p->pSatSynG ? bmcg_sat_solver_clausenum(p->pSatSynG)   : sat_solver_nclauses(p->pSatSyn)   );
    printf( "Conf =%9d  ", p->pSatSynG ? bmcg_sat_solver_conflictnum(p->pSatSynG) : sat_solver_nconflicts(p->pSatSyn) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
}